

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::Write
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,TPZStream *buf,int withclassid)

{
  long *plVar1;
  _List_node_base *p_Var2;
  int sz;
  int classid;
  TPZManVector<int,_3> order;
  
  TPZInterpolatedElement::Write((TPZInterpolatedElement *)this,buf,withclassid);
  plVar1 = TPZVec<long>::begin(&(this->fConnectIndexes).super_TPZVec<long>);
  (*buf->_vptr_TPZStream[5])(buf,plVar1,9);
  sz = 0;
  TPZManVector<int,_3>::TPZManVector(&order,3,&sz);
  TPZIntQuad::GetOrder
            (&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).fIntRule,&order.super_TPZVec<int>);
  TPZStream::Write<int>(buf,&order.super_TPZVec<int>);
  TPZStream::Write<int>(buf,&(this->fSideOrient).super_TPZVec<int>);
  plVar1 = TPZVec<long>::begin(&(this->fConnectIndexes).super_TPZVec<long>);
  (*buf->_vptr_TPZStream[5])(buf,plVar1,9);
  (*buf->_vptr_TPZStream[3])
            (buf,&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
                  super_TPZInterpolationSpace.fPreferredOrder,1);
  TPZStream::Write<int>(buf,&(this->fSideOrient).super_TPZVec<int>);
  sz = (int)(this->fRestraints).
            super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl.
            _M_node._M_size;
  (*buf->_vptr_TPZStream[3])(buf,&sz,1);
  p_Var2 = (_List_node_base *)&this->fRestraints;
  while (p_Var2 = (((_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->fRestraints) {
    TPZOneShapeRestraint::Write((TPZOneShapeRestraint *)(p_Var2 + 1),buf);
  }
  classid = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x20))(this);
  (*buf->_vptr_TPZStream[3])(buf,&classid,1);
  TPZManVector<int,_3>::~TPZManVector(&order);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Write(TPZStream &buf, int withclassid) const
{
	TPZInterpolatedElement::Write(buf,withclassid);
  buf.Write(fConnectIndexes.begin(),TSHAPE::NSides);
	TPZManVector<int,3> order(3,0);
	this->fIntRule.GetOrder(order);
	buf.Write(order);
    buf.Write(fSideOrient);

	buf.Write(this->fConnectIndexes.begin(),TSHAPE::NSides);
	buf.Write(&this->fPreferredOrder,1);
    buf.Write(fSideOrient);
    int sz = fRestraints.size();
    buf.Write(&sz);
    for (std::list<TPZOneShapeRestraint>::const_iterator it = fRestraints.begin(); it != fRestraints.end(); it++) {
        it->Write(buf);
    }
	int classid = this->ClassId();
	buf.Write ( &classid, 1 );
}